

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUIComponent.cpp
# Opt level: O1

void __thiscall nite::NavUI::update(NavUI *this,BaseUIComponent *comp)

{
  long *plVar1;
  element_type *peVar2;
  byte bVar3;
  bool bVar4;
  uint key;
  pointer psVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  _Hash_node_base *p_Var9;
  long lVar10;
  ulong uVar11;
  float Step;
  BaseUIComponent *local_98;
  anon_class_16_2_3ef9e608 getSelectedChild;
  undefined1 local_78 [16];
  BaseUIComponent *local_68;
  ListenerInfo *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  anon_class_16_2_044dc475 solveAutoScroll;
  BaseUIComponent *local_38;
  BaseUIComponent *comp_local;
  
  if (comp == (BaseUIComponent *)0x0) {
    return;
  }
  local_98 = (BaseUIComponent *)&stack0xffffffffffffffc8;
  solveAutoScroll.comp = &local_98;
  if (this->colorFlip == 0) {
    Step = 0.11;
  }
  else {
    Step = 0.34;
  }
  getSelectedChild.comp = (BaseUIComponent **)this;
  local_50 = (undefined1  [8])local_98;
  local_38 = comp;
  solveAutoScroll.getSelectedChild._7_1_ =
       Color::cInterpDiscrete
                 (&this->color,(Color *)((long)&(this->a).r + (ulong)((this->colorFlip ^ 1) << 4)),
                  Step);
  if ((local_38->visible == true) &&
     (p_Var9 = (local_38->keyListeners)._M_h._M_before_begin._M_nxt,
     p_Var9 != (_Hash_node_base *)0x0)) {
    do {
      getSelectedChild.this = (NavUI *)local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&getSelectedChild.this,p_Var9[1]._M_nxt,
                 (long)&(p_Var9[1]._M_nxt)->_M_nxt + (long)&(p_Var9[2]._M_nxt)->_M_nxt);
      key = translateKey((string *)&getSelectedChild.this);
      bVar4 = keyboardPressed(key);
      if (getSelectedChild.this != (NavUI *)local_78) {
        operator_delete(getSelectedChild.this);
      }
      if (bVar4) {
        local_60 = (ListenerInfo *)operator_new(1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<nite::ListenerInfo*>
                  (&local_58,local_60);
        local_68 = local_38;
        if (p_Var9[7]._M_nxt == (_Hash_node_base *)0x0) {
          uVar6 = std::__throw_bad_function_call();
          if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
          }
          _Unwind_Resume(uVar6);
        }
        (*(code *)p_Var9[8]._M_nxt)(p_Var9 + 5,&local_60,&local_68);
        if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
        }
      }
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  bVar3 = solveAutoScroll.getSelectedChild._7_1_;
  if ((this->enable & solveAutoScroll.getSelectedChild._7_1_) == 1) {
    this->colorFlip = (bool)(this->colorFlip ^ 1);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if (bVar3 == 0 && this->enable == true) {
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if (((this->enable == true) && (bVar4 = keyboardPressed(local_38->onClickAnalogueKey), bVar4)) &&
     (psVar5 = (local_38->children).
               super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (local_38->children).
     super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar5)) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      plVar1 = *(long **)((long)&(psVar5->
                                 super___shared_ptr<nite::BaseUIComponent,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar10);
      if ((int)plVar1[0xc] == this->current) {
        (**(code **)(*plVar1 + 0x50))();
      }
      uVar11 = uVar11 + 1;
      psVar5 = (local_38->children).
               super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar11 < (ulong)((long)(local_38->children).
                                    super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4))
    ;
  }
  if ((this->enable == true) && (bVar4 = keyboardPressed(0x48), bVar4)) {
    peVar2 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2->xorient == true) {
      if (peVar2->yorient == true) {
LAB_001b6ead:
        if ((peVar2->yorient == true) && (this->split != 0)) {
          iVar8 = this->current;
          uVar11 = (long)iVar8 + 1;
          iVar7 = iVar8;
          if (((int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                    (long)this->split) != 0) &&
             (iVar7 = (int)uVar11,
             ((long)(local_38->children).
                    super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(local_38->children).
                    super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < uVar11)) {
            iVar7 = iVar8;
          }
          this->current = iVar7;
        }
      }
      else {
LAB_001b6e82:
        uVar11 = (long)this->current + 1;
        iVar8 = (int)uVar11;
        if ((ulong)((long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_38->children).
                          super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar11) {
          iVar8 = this->current;
        }
        this->current = iVar8;
      }
    }
    else {
      if (peVar2->yorient == true) goto LAB_001b6e82;
      if (peVar2->xorient != false) goto LAB_001b6ead;
    }
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((this->enable == true) && (bVar4 = keyboardPressed(0x47), bVar4)) {
    peVar2 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2->xorient == true) {
      if (peVar2->yorient == true) {
LAB_001b6f4f:
        if ((peVar2->yorient == true) && (this->split != 0)) {
          iVar8 = this->current;
          this->current = iVar8 + -1;
          if ((iVar8 < 1) || (iVar8 % this->split == 0)) {
            this->current = iVar8;
          }
        }
      }
      else {
LAB_001b6f3a:
        this->current = this->current - (uint)(0 < this->current);
      }
    }
    else {
      if (peVar2->yorient == true) goto LAB_001b6f3a;
      if (peVar2->xorient != false) goto LAB_001b6f4f;
    }
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if ((this->enable == true) && (bVar4 = keyboardPressed(0x4a), bVar4)) {
    peVar2 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2->xorient == true) {
      if (peVar2->yorient == true) {
LAB_001b6fec:
        if ((peVar2->yorient == true) && (this->split != 0)) {
          iVar8 = this->current;
          iVar7 = this->split + iVar8;
          this->current = iVar7;
          if (((long)(local_38->children).
                     super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_38->children).
                     super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U < (ulong)(long)iVar7) {
            this->current = iVar8;
          }
        }
      }
      else {
LAB_001b6fc7:
        this->current =
             this->current +
             (uint)((long)this->index + 1U <
                   (ulong)((long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_38->children).
                                 super__Vector_base<std::shared_ptr<nite::BaseUIComponent>,_std::allocator<std::shared_ptr<nite::BaseUIComponent>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
    else {
      if (peVar2->yorient == true) goto LAB_001b6fc7;
      if (peVar2->xorient != false) goto LAB_001b6fec;
    }
    update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
    (*local_38->_vptr_BaseUIComponent[7])();
  }
  if (this->enable != true) {
    return;
  }
  bVar4 = keyboardPressed(0x49);
  if (!bVar4) {
    return;
  }
  peVar2 = (local_38->layout).super___shared_ptr<nite::LayoutSystemUI,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2->xorient == true) {
    if (peVar2->yorient != true) {
LAB_001b706b:
      this->current = this->current - (uint)(0 < this->index);
      goto LAB_001b7096;
    }
  }
  else {
    if (peVar2->yorient == true) goto LAB_001b706b;
    if (peVar2->xorient == false) goto LAB_001b7096;
  }
  if ((peVar2->yorient == true) && (this->split != 0)) {
    iVar8 = this->current - this->split;
    if (iVar8 < 0) {
      iVar8 = this->current;
    }
    this->current = iVar8;
  }
LAB_001b7096:
  update::anon_class_16_2_044dc475::operator()((anon_class_16_2_044dc475 *)local_50);
  (*local_38->_vptr_BaseUIComponent[7])();
  return;
}

Assistant:

void nite::NavUI::update(BaseUIComponent *comp){
    if(comp == NULL){
        return;
    }

    auto getSelectedChild = [&](){
        for(int i = 0; i < comp->children.size(); ++i){
            if(comp->children[i]->nav.index == current){
                return comp->children[i];
            }
        }
        return Shared<nite::BaseUIComponent>(NULL);
    };

    auto solveAutoScroll = [&](){
        if(!comp->allowOverflow){
            return;
        }
        auto child = getSelectedChild();
        if(child.get() == NULL){
            return;
        }
        auto space = comp->computeSize();
        auto area = child->computeSize();
        auto p = child->position + comp->scrollOffset;
        if( p.x + area.x * 0.5f <= 0.0f || p.y + area.y * 0.5f <= 0.0f || 
            p.x - area.x * 0.5f >= space.x || p.y - area.y * 0.5f >= space.y ||
            p.x - area.x * 0.5f < 0.0f || p.y - area.y * 0.5f < 0.0f || 
            p.x + area.x * 0.5f > space.x || p.y + area.y * 0.5f > space.y){
            // TODO: this is going to change to accodomate vinline (instead of left to right, top to bottom)
            // see commented line below
            comp->scrollOffset.y = -(child->position.y - area.y * 0.5f) + area.y;
            //comp->scrollOffset.x = -(child->position.x - area.x * 0.5f);
            comp->recalculate();
        }        
    };

	auto lrpUpd = color.cInterpDiscrete(colorFlip ? a : b, colorFlip ? 0.34f : 0.11f);

	if(comp->visible){
		for(auto &key : comp->keyListeners){
			if(nite::keyboardPressed(nite::translateKey(key.first))){
				key.second(Shared<nite::ListenerInfo>(new nite::ListenerInfo()), comp);
			}
		}		
	}

	if(enable && lrpUpd){
		colorFlip = !colorFlip;
		comp->recalculate();
	}

	if(enable && !lrpUpd){
		comp->recalculate();	
	}

	if(enable && nite::keyboardPressed(comp->onClickAnalogueKey)){
		for(int i = 0; i < comp->children.size(); ++i){
			if(comp->children[i]->nav.index == current){
				comp->children[i]->onClick();
			}
		}
	}

	if(enable && nite::keyboardPressed(nite::keyRIGHT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current = (current + 1) % split == 0 || (current + 1) > comp->children.size()-1 ? current : current + 1;
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyLEFT)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = current-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			--current;
			if(current < 0 || (current + 1) % split == 0){
				++current;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}

	if(enable && nite::keyboardPressed(nite::keyDOWN)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index+1 >= comp->children.size() ? current : current + 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current += split;
			if(current > comp->children.size()-1){
				current -= split;
			}
		}		
        solveAutoScroll();
		comp->recalculate();
	}	


	if(enable && nite::keyboardPressed(nite::keyUP)){
		if(comp->layout->xorient && !comp->layout->yorient || !comp->layout->xorient && comp->layout->yorient){
			current = index-1 < 0 ? current : current - 1;
		}else
		if(comp->layout->xorient && comp->layout->yorient && split != 0){
			current -= split;
			if(current < 0){
				current += split;
			}
		}	      
        solveAutoScroll();	
		comp->recalculate();
	}
}